

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O0

int SetMotorRelativeIM483I(IM483I *pIM483I,int val,BOOL bForce)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uint local_448;
  uint local_444;
  int local_440;
  uint8 local_438 [4];
  int recvbuflen;
  char recvbuf [512];
  uint8 local_228 [4];
  int sendbuflen;
  char sendbuf [512];
  BOOL bForce_local;
  int val_local;
  IM483I *pIM483I_local;
  
  local_440 = val;
  if (0x7ffffe < val) {
    local_440 = 0x7fffff;
  }
  if (local_440 < -0x7ffffe) {
    local_448 = 0xff800001;
  }
  else {
    local_444 = val;
    if (0x7ffffe < val) {
      local_444 = 0x7fffff;
    }
    local_448 = local_444;
  }
  if (bForce == 0) {
    iVar1 = local_448 - pIM483I->LastRval;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    iVar2 = pIM483I->ThresholdRval;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    if (iVar1 < iVar2) {
      return 0;
    }
  }
  memset(local_228,0,0x200);
  sprintf((char *)local_228,"R%d\r",(ulong)local_448);
  sVar3 = strlen((char *)local_228);
  iVar1 = (int)sVar3;
  iVar2 = WriteDataIM483I(pIM483I,local_228,iVar1,pIM483I->bytedelayus);
  if (iVar2 != 0) {
    printf("Error writing data to a IM483I. \n");
    return 1;
  }
  if ((pIM483I->bSaveRawData != 0) && (pIM483I->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_228,(long)iVar1,1,(FILE *)pIM483I->pfSaveFile);
    fflush((FILE *)pIM483I->pfSaveFile);
  }
  mSleep(0x14);
  if (pIM483I->bCheckState != 0) {
    memset(local_438,0,0x200);
    iVar2 = ReadAllRS232Port(&pIM483I->RS232Port,local_438,iVar1 + 1);
    if (iVar2 != 0) {
      printf("Error reading data from a IM483I. \n");
      return 1;
    }
    if ((pIM483I->bSaveRawData != 0) && (pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_438,(long)(iVar1 + 1),1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    iVar2 = strncmp((char *)local_438,(char *)local_228,(long)iVar1);
    if ((iVar2 != 0) || (local_438[iVar1] != '\n')) {
      printf("Error reading data from a IM483I : Invalid data. \n");
      return 4;
    }
  }
  pIM483I->LastRval = local_448;
  return 0;
}

Assistant:

inline int SetMotorRelativeIM483I(IM483I* pIM483I, int val, BOOL bForce)
{
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	val = max(min(val, (int)MAX_INDEX_IM483I), -(int)MAX_INDEX_IM483I);

	// The requested value is only applied if it is slightly different from the current value.
	if ((!bForce)&&(abs(val-pIM483I->LastRval) < abs(pIM483I->ThresholdRval))) return EXIT_SUCCESS;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "R%d\r", val);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a IM483I. \n");
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(20);

	if (pIM483I->bCheckState)
	{
		// Should echo and add \n...

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sendbuflen+1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a IM483I. \n");
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if ((strncmp(recvbuf, sendbuf, sendbuflen) != 0)||(recvbuf[recvbuflen-1] != '\n'))
		{
			printf("Error reading data from a IM483I : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
	}

	// Update last known value.
	pIM483I->LastRval = val;

	return EXIT_SUCCESS;
}